

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Object * __thiscall symbols::StringObject::nextItem(StringObject *this)

{
  char __c;
  int iVar1;
  size_type sVar2;
  StringObject *pSVar3;
  reference pvVar4;
  allocator<char> local_51;
  string local_50;
  StringObject *curStr;
  StringObject *local_18;
  StringObject *this_local;
  
  iVar1 = this->iter_index;
  local_18 = this;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->value);
  if (iVar1 < (int)sVar2) {
    pSVar3 = (StringObject *)operator_new(0x38);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (&this->value,(long)this->iter_index);
    __c = *pvVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,1,__c,&local_51);
    StringObject(pSVar3,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    this->iter_index = this->iter_index + 1;
    this_local = pSVar3;
  }
  else {
    pSVar3 = (StringObject *)operator_new(0x10);
    NullObject::NullObject((NullObject *)pSVar3);
    this_local = pSVar3;
  }
  return (Object *)this_local;
}

Assistant:

Object* StringObject::nextItem()
{
    if(this->iter_index >= (int)this->value.size()){
        return new NullObject();
    }
    auto curStr = new StringObject(std::string(1, this->value.at(this->iter_index)));
    this->iter_index++;
    return curStr;
}